

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O2

int Gia_ManCountMinterms(Gia_ManAre_t *p)

{
  Gia_StaAre_t *pCube;
  uint *pStore;
  ulong uVar1;
  ulong __nmemb;
  int iVar2;
  uint uVar3;
  uint uVar4;
  
  uVar3 = p->pAig->nRegs;
  if ((int)uVar3 < 0x1f) {
    __nmemb = (ulong)(((uint)(1 << ((byte)uVar3 & 0x1f)) >> 5) + (uint)(uVar3 < 5));
    pStore = (uint *)calloc(__nmemb,4);
    iVar2 = p->nStas;
    uVar1 = 1;
    while ((uVar4 = (uint)uVar1, (int)uVar4 < iVar2 && (p->ppStas[uVar1 >> 0x14] != (uint *)0x0))) {
      pCube = (Gia_StaAre_t *)(p->ppStas[uVar1 >> 0x14] + (long)p->nSize * (ulong)(uVar4 & 0xfffff))
      ;
      if (-1 < (int)pCube->iPrev) {
        Gia_ManCountMintermsInCube(pCube,uVar3,pStore);
      }
      uVar1 = (ulong)(uVar4 + 1);
    }
    iVar2 = 0;
    for (uVar1 = 0; __nmemb != uVar1; uVar1 = uVar1 + 1) {
      uVar3 = (pStore[uVar1] >> 1 & 0x55555555) + (pStore[uVar1] & 0x55555555);
      uVar3 = (uVar3 >> 2 & 0x33333333) + (uVar3 & 0x33333333);
      uVar3 = (uVar3 >> 4 & 0x7070707) + (uVar3 & 0x7070707);
      uVar3 = (uVar3 >> 8 & 0xf000f) + (uVar3 & 0xf000f);
      iVar2 = (uVar3 >> 0x10) + iVar2 + (uVar3 & 0xffff);
    }
    free(pStore);
  }
  else {
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int Gia_ManCountMinterms( Gia_ManAre_t * p )
{
    Gia_StaAre_t * pCube;
    unsigned * pMemory;
    int i, nMemSize, Counter = 0;
    if ( Gia_ManRegNum(p->pAig) > 30 )
        return -1;
    nMemSize = Abc_BitWordNum( 1 << Gia_ManRegNum(p->pAig) );
    pMemory  = ABC_CALLOC( unsigned, nMemSize );
    Gia_ManAreForEachCubeStore( p, pCube, i )
        if ( Gia_StaIsUsed(pCube) )
            Gia_ManCountMintermsInCube( pCube, Gia_ManRegNum(p->pAig), pMemory );
    for ( i = 0; i < nMemSize; i++ )
        Counter += Gia_WordCountOnes( pMemory[i] );
    ABC_FREE( pMemory );
    return Counter;
}